

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O1

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,node_type *n)

{
  node_type *pnVar1;
  pointer prVar2;
  stored_size_type sVar3;
  ulong uVar4;
  pointer prVar5;
  ulong uVar6;
  size_t sVar7;
  double dVar8;
  ulong uVar9;
  undefined7 uVar10;
  container_type *__dest;
  ulong uVar11;
  container_type *__src;
  
  sVar3 = (this->overwritable_nodes_).
          super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
          m_holder.m_size;
  if (sVar3 == 0) {
    uVar11 = (this->tree_).m_holder.m_size;
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
    ::priv_push_back<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>const&>
              ((vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
                *)&this->tree_,n);
  }
  else {
    uVar4 = (this->tree_).m_holder.m_size;
    uVar11 = (this->overwritable_nodes_).
             super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
             m_holder.m_start[sVar3 - 1];
    (this->overwritable_nodes_).
    super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
    m_size = sVar3 - 1;
    if (uVar4 <= uVar11) {
      boost::container::throw_out_of_range("vector::at out of range");
    }
    prVar5 = (this->tree_).m_holder.m_start;
    pnVar1 = prVar5 + uVar11;
    uVar10 = *(undefined7 *)&n->field_0x1;
    sVar7 = n->parent;
    prVar2 = prVar5 + uVar11;
    prVar2->is_leaf = n->is_leaf;
    *(undefined7 *)&prVar2->field_0x1 = uVar10;
    prVar2->parent = sVar7;
    if (pnVar1 != n) {
      __dest = &prVar5[uVar11].entry;
      __src = &n->entry;
      uVar4 = (pnVar1->entry).
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              .m_holder.m_size;
      uVar6 = (n->entry).
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              .m_holder.m_size;
      uVar9 = uVar6;
      if (uVar4 < uVar6) {
        if (uVar4 != 0) {
          memmove(__dest,__src,uVar4 * 8);
          __src = (container_type *)
                  ((long)&(__src->
                          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                          ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                          storage + uVar4 * 8);
          __dest = (container_type *)
                   ((long)&(__dest->
                           super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                           ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                           storage + uVar4 * 8);
        }
        uVar9 = uVar6 - uVar4;
      }
      if (uVar9 != 0) {
        memmove(__dest,__src,uVar9 * 8);
      }
      (pnVar1->entry).
      super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      .m_holder.m_size = uVar6;
    }
    dVar8 = (n->box).center.values_.elems[1];
    (pnVar1->box).center.values_.elems[0] = (n->box).center.values_.elems[0];
    (pnVar1->box).center.values_.elems[1] = dVar8;
    dVar8 = (n->box).radius.values_.elems[1];
    (pnVar1->box).radius.values_.elems[0] = (n->box).radius.values_.elems[0];
    (pnVar1->box).radius.values_.elems[1] = dVar8;
  }
  return uVar11;
}

Assistant:

std::size_t add_node(const node_type& n)
    {
        if(overwritable_nodes_.empty())
        {
            const std::size_t idx = tree_.size();
            tree_.push_back(n);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_nodes_.back();
            overwritable_nodes_.pop_back();
            tree_.at(idx) = n;
            return idx;
        }
    }